

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcNtk.c
# Opt level: O0

Abc_Ntk_t * Abc_NtkRestrashWithLatches(Abc_Ntk_t *pNtk,int nLatches)

{
  Abc_Aig_t *pMan;
  int iVar1;
  Abc_Obj_t *pObj_00;
  Abc_Obj_t *pAVar2;
  Abc_Obj_t *p1;
  int local_34;
  int i;
  Abc_Obj_t *pObj;
  Abc_Ntk_t *pNtkAig;
  int nLatches_local;
  Abc_Ntk_t *pNtk_local;
  
  iVar1 = Abc_NtkIsStrash(pNtk);
  if (iVar1 == 0) {
    __assert_fail("Abc_NtkIsStrash(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcNtk.c"
                  ,0x248,"Abc_Ntk_t *Abc_NtkRestrashWithLatches(Abc_Ntk_t *, int)");
  }
  pNtk_local = Abc_NtkStartFromWithLatches(pNtk,ABC_NTK_STRASH,ABC_FUNC_AIG,nLatches);
  for (local_34 = 0; iVar1 = Vec_PtrSize(pNtk->vObjs), local_34 < iVar1; local_34 = local_34 + 1) {
    pObj_00 = Abc_NtkObj(pNtk,local_34);
    if ((pObj_00 != (Abc_Obj_t *)0x0) && (iVar1 = Abc_ObjIsNode(pObj_00), iVar1 != 0)) {
      pMan = (Abc_Aig_t *)pNtk_local->pManFunc;
      pAVar2 = Abc_ObjChild0Copy(pObj_00);
      p1 = Abc_ObjChild1Copy(pObj_00);
      pAVar2 = Abc_AigAnd(pMan,pAVar2,p1);
      (pObj_00->field_6).pCopy = pAVar2;
    }
  }
  Abc_NtkFinalize(pNtk,pNtk_local);
  iVar1 = Abc_NtkCheck(pNtk_local);
  if (iVar1 == 0) {
    printf("Abc_NtkStrash: The network check has failed.\n");
    Abc_NtkDelete(pNtk_local);
    pNtk_local = (Abc_Ntk_t *)0x0;
  }
  return pNtk_local;
}

Assistant:

Abc_Ntk_t * Abc_NtkRestrashWithLatches( Abc_Ntk_t * pNtk, int nLatches )
{
    Abc_Ntk_t * pNtkAig;
    Abc_Obj_t * pObj;
    int i;
    assert( Abc_NtkIsStrash(pNtk) );
    // start the new network (constants and CIs of the old network will point to the their counterparts in the new network)
    pNtkAig = Abc_NtkStartFromWithLatches( pNtk, ABC_NTK_STRASH, ABC_FUNC_AIG, nLatches );
    // restrash the nodes (assuming a topological order of the old network)
    Abc_NtkForEachNode( pNtk, pObj, i )
        pObj->pCopy = Abc_AigAnd( (Abc_Aig_t *)pNtkAig->pManFunc, Abc_ObjChild0Copy(pObj), Abc_ObjChild1Copy(pObj) );
    // finalize the network
    Abc_NtkFinalize( pNtk, pNtkAig );
    // make sure everything is okay
    if ( !Abc_NtkCheck( pNtkAig ) )
    {
        printf( "Abc_NtkStrash: The network check has failed.\n" );
        Abc_NtkDelete( pNtkAig );
        return NULL;
    }
    return pNtkAig;

}